

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowTypeExtension::ArrowTypeExtension
          (ArrowTypeExtension *this,string *vendor_name,string *type_name,
          populate_arrow_schema_t populate_arrow_schema,get_type_t get_type,
          shared_ptr<duckdb::ArrowTypeExtensionData,_true> *type,cast_arrow_duck_t arrow_to_duckdb,
          cast_duck_arrow_t duckdb_to_arrow)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ArrowTypeExtensionData *pAVar3;
  allocator local_b1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->populate_arrow_schema = populate_arrow_schema;
  this->get_type = get_type;
  ::std::__cxx11::string::string((string *)&local_90,"arrow.opaque",&local_b1);
  ::std::__cxx11::string::string((string *)&local_50,(string *)vendor_name);
  ::std::__cxx11::string::string((string *)&local_70,(string *)type_name);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  ArrowExtensionMetadata::ArrowExtensionMetadata
            (&this->extension_metadata,&local_90,&local_50,&local_70,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_90);
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  pAVar3 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(&this->type_extension);
  pAVar3->arrow_to_duckdb = arrow_to_duckdb;
  pAVar3 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->(&this->type_extension);
  pAVar3->duckdb_to_arrow = duckdb_to_arrow;
  return;
}

Assistant:

ArrowTypeExtension::ArrowTypeExtension(string vendor_name, string type_name,
                                       populate_arrow_schema_t populate_arrow_schema, get_type_t get_type,
                                       shared_ptr<ArrowTypeExtensionData> type, cast_arrow_duck_t arrow_to_duckdb,
                                       cast_duck_arrow_t duckdb_to_arrow)
    : populate_arrow_schema(populate_arrow_schema), get_type(get_type),
      extension_metadata(ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL, std::move(vendor_name),
                         std::move(type_name), {}),
      type_extension(std::move(type)) {
	type_extension->arrow_to_duckdb = arrow_to_duckdb;
	type_extension->duckdb_to_arrow = duckdb_to_arrow;
}